

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

Component __thiscall ui::anon_unknown_1::Header(anon_unknown_1 *this,string *title,Component *body)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  anon_class_48_2_606a7a8b local_a0;
  function<std::shared_ptr<ftxui::Node>_()> local_70;
  shared_ptr<ftxui::ComponentBase> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Component *local_20;
  Component *body_local;
  string *title_local;
  
  local_20 = body;
  body_local = (Component *)title;
  title_local = (string *)this;
  std::operator+(&local_40,anon_var_dwarf_b7986,title);
  std::__cxx11::string::operator=((string *)title,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&local_50,body);
  std::__cxx11::string::string((string *)&local_a0,(string *)title);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&local_a0.body,body);
  std::function<std::shared_ptr<ftxui::Node>()>::
  function<ui::(anonymous_namespace)::Header(std::__cxx11::string,std::shared_ptr<ftxui::ComponentBase>)::__0,void>
            ((function<std::shared_ptr<ftxui::Node>()> *)&local_70,&local_a0);
  ftxui::Renderer((ftxui *)this,&local_50,&local_70);
  std::function<std::shared_ptr<ftxui::Node>_()>::~function(&local_70);
  (anonymous_namespace)::Header(std::__cxx11::string,std::shared_ptr<ftxui::ComponentBase>)::$_0::
  ~__0((__0 *)&local_a0);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_50);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Header(std::string title, Component body) {
  // Add extra margin on the left.
  title = "─" + title;

  return Renderer(body, [=] {
    return vbox({
        dbox({
            separator(),
            text(title),
        }),
        body->Render(),
    });
  });
}